

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

void Gia_ManSeqEquivMerge(Gia_Man_t *p,Gia_Man_t **pPart)

{
  uint *puVar1;
  size_t __size;
  int iVar2;
  Gia_Man_t *pGVar3;
  Gia_Obj_t *pGVar4;
  undefined4 *__s;
  void *__s_00;
  Gia_Rpr_t *pGVar5;
  ulong uVar6;
  int *piVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  Gia_Rpr_t *pGVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  
  iVar2 = p->nObjs;
  __size = (long)iVar2 * 4;
  __s = (undefined4 *)malloc(__size);
  memset(__s,0xff,__size);
  __s_00 = malloc(__size);
  memset(__s_00,0xff,__size);
  if ((p->pReprs != (Gia_Rpr_t *)0x0) || (p->pNexts != (int *)0x0)) {
    __assert_fail("p->pReprs == NULL && p->pNexts == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x127a,"void Gia_ManSeqEquivMerge(Gia_Man_t *, Gia_Man_t **)");
  }
  pGVar5 = (Gia_Rpr_t *)calloc((long)iVar2,4);
  p->pReprs = pGVar5;
  uVar6 = (ulong)(uint)p->nObjs;
  if (0 < p->nObjs) {
    lVar8 = 0;
    do {
      p->pReprs[lVar8] = (Gia_Rpr_t)((uint)p->pReprs[lVar8] | 0xfffffff);
      lVar8 = lVar8 + 1;
      uVar6 = (ulong)p->nObjs;
    } while (lVar8 < (long)uVar6);
  }
  *__s = 0;
  lVar8 = 0;
  do {
    pGVar3 = pPart[lVar8];
    pGVar5 = pGVar3->pReprs;
    if ((pGVar5 == (Gia_Rpr_t *)0x0) || (piVar7 = pGVar3->pNexts, piVar7 == (int *)0x0)) {
      __assert_fail("pPart[n]->pReprs != NULL && pPart[n]->pNexts != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                    ,0x1282,"void Gia_ManSeqEquivMerge(Gia_Man_t *, Gia_Man_t **)");
    }
    iVar2 = pGVar3->nObjs;
    uVar10 = (ulong)iVar2;
    if (0 < (long)uVar10) {
      lVar13 = 0;
      pGVar12 = pGVar5;
      do {
        if (((uint)*pGVar12 & 0xfffffff) == 0) {
          __s[*(uint *)((long)&pGVar3->pObjs->Value + lVar13)] = 0;
        }
        lVar13 = lVar13 + 0xc;
        pGVar12 = pGVar12 + 1;
      } while (uVar10 * 0xc != lVar13);
    }
    if (1 < iVar2) {
      uVar11 = 1;
      do {
        if ((((uint)pGVar5[uVar11] & 0xfffffff) == 0xfffffff) && (0 < piVar7[uVar11])) {
          pGVar4 = pGVar3->pObjs;
          uVar9 = pGVar4[uVar11].Value;
          if (lVar8 == 1) {
            if (piVar7[uVar11] < 1) {
              __assert_fail("Gia_ObjIsHead(pPart[n], i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                            ,0x128b,"void Gia_ManSeqEquivMerge(Gia_Man_t *, Gia_Man_t **)");
            }
            uVar14 = uVar11 & 0xffffffff;
            do {
              if (iVar2 <= (int)uVar14) goto LAB_001f5e1c;
              if (__s[pGVar4[uVar14].Value] != 0xffffffff) {
                uVar9 = __s[pGVar4[uVar14].Value];
              }
              puVar1 = (uint *)(piVar7 + uVar14);
              uVar14 = (ulong)*puVar1;
            } while (0 < (int)*puVar1);
          }
          if (piVar7[uVar11] < 1) {
            __assert_fail("Gia_ObjIsHead(pPart[n], i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                          ,0x128f,"void Gia_ManSeqEquivMerge(Gia_Man_t *, Gia_Man_t **)");
          }
          uVar14 = uVar11 & 0xffffffff;
          do {
            if (iVar2 <= (int)uVar14) {
LAB_001f5e1c:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            __s[pGVar4[uVar14].Value] = uVar9;
            puVar1 = (uint *)(piVar7 + uVar14);
            uVar14 = (ulong)*puVar1;
          } while (0 < (int)*puVar1);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar10);
    }
    bVar15 = lVar8 != 0;
    lVar8 = lVar8 + 1;
    if (bVar15) {
      if (0 < (int)uVar6) {
        uVar10 = 0;
        do {
          lVar8 = (long)(int)__s[uVar10];
          if ((lVar8 != -1) && (*(int *)((long)__s_00 + lVar8 * 4) == -1)) {
            *(int *)((long)__s_00 + lVar8 * 4) = (int)uVar10;
            __s[uVar10] = 0xffffffff;
          }
          uVar10 = uVar10 + 1;
        } while ((uVar6 & 0xffffffff) != uVar10);
      }
      if (0 < p->nObjs) {
        lVar8 = 0;
        do {
          if ((long)(int)__s[lVar8] != -1) {
            p->pReprs[lVar8] =
                 (Gia_Rpr_t)
                 ((uint)p->pReprs[lVar8] & 0xf0000000 |
                 *(uint *)((long)__s_00 + (long)(int)__s[lVar8] * 4) & 0xfffffff);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < p->nObjs);
      }
      free(__s);
      if (__s_00 != (void *)0x0) {
        free(__s_00);
      }
      piVar7 = Gia_ManDeriveNexts(p);
      p->pNexts = piVar7;
      return;
    }
  } while( true );
}

Assistant:

void Gia_ManSeqEquivMerge( Gia_Man_t * p, Gia_Man_t * pPart[2] )
{
    int i, iObj, * pClasses    = ABC_FALLOC( int, Gia_ManObjNum(p) );
    int n, Repr, * pClass2Repr = ABC_FALLOC( int, Gia_ManObjNum(p) );
    // initialize equiv class representation in the big AIG
    assert( p->pReprs  == NULL && p->pNexts  == NULL );
    p->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        Gia_ObjSetRepr( p, i, GIA_VOID );
    // map equivalences of p into classes
    pClasses[0] = 0;
    for ( n = 0; n < 2; n++ )
    {
        assert( pPart[n]->pReprs != NULL && pPart[n]->pNexts != NULL );
        for ( i = 0; i < Gia_ManObjNum(pPart[n]); i++ )
            if ( Gia_ObjRepr(pPart[n], i) == 0 )
                pClasses[Gia_ManObj(pPart[n], i)->Value] = 0;
        Gia_ManForEachClass( pPart[n], i )
        {
            Repr = Gia_ManObj(pPart[n], i)->Value;
            if ( n == 1 )
            {
                Gia_ClassForEachObj( pPart[n], i, iObj )
                    if ( pClasses[Gia_ManObj(pPart[n], iObj)->Value] != -1 )
                        Repr = pClasses[Gia_ManObj(pPart[n], iObj)->Value];
            }
            Gia_ClassForEachObj( pPart[n], i, iObj )
                pClasses[Gia_ManObj(pPart[n], iObj)->Value] = Repr;
        }
    }
    // map representatives of each class
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        if ( pClasses[i] != -1 && pClass2Repr[pClasses[i]] == -1 )
        {
            pClass2Repr[pClasses[i]] = i;
            pClasses[i] = -1;
        }
    // remap the remaining classes
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        if ( pClasses[i] != -1 )
            p->pReprs[i].iRepr = pClass2Repr[pClasses[i]];
    ABC_FREE(pClasses);
    ABC_FREE(pClass2Repr);
    // create next pointers
    p->pNexts = Gia_ManDeriveNexts( p );
}